

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  scoped_padder *this_00;
  long in_RSI;
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t text_size;
  scoped_padder p_1;
  size_t *value;
  scoped_padder *in_stack_ffffffffffffff40;
  memory_buf_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  scoped_padder *in_stack_ffffffffffffff60;
  memory_buf_t *dest_00;
  int in_stack_ffffffffffffff74;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(padding_info *)in_RDI,
               in_stack_ffffffffffffff48);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff40);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)&(in_RDI->super_buffer<char>).ptr_);
    if (bVar1) {
      in_stack_ffffffffffffff48 =
           (memory_buf_t *)std::char_traits<char>::length((char_type *)0x1f547e);
      scoped_padder::count_digits<int>(0);
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(padding_info *)in_RDI,
               in_stack_ffffffffffffff48);
    dest_00 = *(memory_buf_t **)(in_RSI + 0x38);
    value = (size_t *)&stack0xffffffffffffff70;
    this_00 = (scoped_padder *)std::char_traits<char>::length((char_type *)0x1f551c);
    *value = (size_t)this_00;
    view.data_._4_4_ = in_stack_ffffffffffffff5c;
    view.data_._0_4_ = in_stack_ffffffffffffff58;
    view.size_ = (size_t)in_stack_ffffffffffffff60;
    fmt_helper::append_string_view(view,in_RDI);
    fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)value);
    fmt_helper::append_int<int>(in_stack_ffffffffffffff74,dest_00);
    scoped_padder::~scoped_padder(this_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled()) {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) +
                        ScopedPadder::count_digits(msg.source.line) + 1;
        } else {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }